

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeCommandListGetContextHandle(ze_command_list_handle_t hCommandList,ze_context_handle_t *phContext)

{
  ze_pfnCommandListGetContextHandle_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnCommandListGetContextHandle_t pfnGetContextHandle;
  ze_context_handle_t *phContext_local;
  ze_command_list_handle_t hCommandList_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->CommandList).pfnGetContextHandle;
    if (p_Var1 == (ze_pfnCommandListGetContextHandle_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hCommandList_local._4_4_ = (*p_Var1)(hCommandList,phContext);
    }
  }
  else {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hCommandList_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeCommandListGetContextHandle(
    ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
    ze_context_handle_t* phContext                  ///< [out] handle of the context on which the command list was created
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnCommandListGetContextHandle_t pfnGetContextHandle = [&result] {
        auto pfnGetContextHandle = ze_lib::context->zeDdiTable.load()->CommandList.pfnGetContextHandle;
        if( nullptr == pfnGetContextHandle ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetContextHandle;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetContextHandle( hCommandList, phContext );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetContextHandle = ze_lib::context->zeDdiTable.load()->CommandList.pfnGetContextHandle;
    if( nullptr == pfnGetContextHandle ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetContextHandle( hCommandList, phContext );
    #endif
}